

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void mkstairs(level *lev,xchar x,xchar y,char up,mkroom *croom)

{
  d_level *lev_00;
  xchar xVar1;
  xchar xVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if (x != '\0') {
    lev_00 = &lev->z;
    xVar1 = dunlev(lev_00);
    if ((up == '\0') || (xVar1 != '\x01')) {
      xVar1 = dunlev(lev_00);
      xVar2 = dunlevs_in_dungeon(lev_00);
      if ((up != '\0') || (xVar1 != xVar2)) {
        if (up == '\0') {
          (lev->dnstair).sx = x;
          uVar3 = 0x20;
          lVar4 = 0xfea0;
          lVar5 = 0xfeb6;
        }
        else {
          (lev->upstair).sx = x;
          uVar3 = 0x10;
          lVar4 = 0xfe98;
          lVar5 = 0xfeb1;
        }
        lev->levname[lVar5] = y;
        *(mkroom **)(lev->levname + lVar4) = croom;
        lev->locations[x][y].typ = '\x1a';
        *(uint *)&lev->locations[x][y].field_0x6 =
             *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f | uVar3;
      }
    }
    return;
  }
  impossible("mkstairs:  bogus stair attempt at <%d,%d>",0,(ulong)(uint)(int)y);
  return;
}

Assistant:

void mkstairs(struct level *lev, xchar x, xchar y, char up, struct mkroom *croom)
{
	if (!x) {
	    impossible("mkstairs:  bogus stair attempt at <%d,%d>", x, y);
	    return;
	}

	/*
	 * We can't make a regular stair off an end of the dungeon.  This
	 * attempt can happen when a special level is placed at an end and
	 * has an up or down stair specified in its description file.
	 */
	if ((dunlev(&lev->z) == 1 && up) ||
			(dunlev(&lev->z) == dunlevs_in_dungeon(&lev->z) && !up))
	    return;

	if (up) {
		lev->upstair.sx = x;
		lev->upstair.sy = y;
		lev->upstairs_room = croom;
	} else {
		lev->dnstair.sx = x;
		lev->dnstair.sy = y;
		lev->dnstairs_room = croom;
	}

	lev->locations[x][y].typ = STAIRS;
	lev->locations[x][y].ladder = up ? LA_UP : LA_DOWN;
}